

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test7::getGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  _variable_type type;
  uint local_45c;
  string local_458 [4];
  uint n_component;
  string local_438 [32];
  stringstream local_418 [8];
  stringstream array_index_sstream;
  ostream local_408;
  uint local_28c;
  undefined1 local_288 [4];
  uint index;
  string variable_type_string;
  uint n_variable_type_components;
  _variable_type variable_type;
  uint variable_array_size;
  uint n_variable;
  float *current_quad_vertex;
  uint counter;
  uint n_quad_vertex;
  size_t n_variables;
  float local_238;
  uint n_quad_vertices;
  float quad_vertices [16];
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  _variables *local_20;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  
  local_20 = variables;
  variables_local = (_variables *)this;
  this_local = (GPUShaderFP64Test7 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(&local_198,
                           "#version 400\n\nlayout(triangles)                      in;\nlayout(triangle_strip, max_vertices=4) out;\n\nin TE_DATA\n{\n"
                          );
  getVariableDeclarations_abi_cxx11_(&local_1d8,this,"te",local_20,"");
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"} in_data[];\n\nout GS_DATA\n{\n");
  getVariableDeclarations_abi_cxx11_((string *)(quad_vertices + 0xe),this,"gs",local_20,"flat");
  poVar2 = std::operator<<(poVar2,(string *)(quad_vertices + 0xe));
  std::operator<<(poVar2,"};\n\nvoid main()\n{\n");
  std::__cxx11::string::~string((string *)(quad_vertices + 0xe));
  std::__cxx11::string::~string((string *)&local_1d8);
  memcpy(&local_238,&DAT_029fd460,0x40);
  sVar3 = std::
          vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
          ::size(local_20);
  for (current_quad_vertex._4_4_ = 0; current_quad_vertex._4_4_ < 4;
      current_quad_vertex._4_4_ = current_quad_vertex._4_4_ + 1) {
    current_quad_vertex._0_4_ = 4;
    uVar5 = (ulong)(current_quad_vertex._4_4_ << 2);
    for (variable_type = VARIABLE_TYPE_BOOL; variable_type < sVar3;
        variable_type = variable_type + VARIABLE_TYPE_BVEC2) {
      pvVar4 = std::
               vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               ::operator[](local_20,(ulong)variable_type);
      uVar1 = pvVar4->array_size;
      pvVar4 = std::
               vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               ::operator[](local_20,(ulong)variable_type);
      variable_type_string.field_2._12_4_ = pvVar4->type;
      variable_type_string.field_2._8_4_ =
           Utils::getNumberOfComponentsForVariableType(variable_type_string.field_2._12_4_);
      Utils::getVariableTypeString_abi_cxx11_
                ((string *)local_288,(Utils *)(ulong)(uint)variable_type_string.field_2._12_4_,type)
      ;
      for (local_28c = 0; local_28c < uVar1; local_28c = local_28c + 1) {
        std::__cxx11::stringstream::stringstream(local_418);
        if (1 < uVar1) {
          poVar2 = std::operator<<(&local_408,"[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28c);
          std::operator<<(poVar2,"]");
        }
        poVar2 = std::operator<<(&local_198,"gs_variable");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,variable_type);
        std::__cxx11::stringstream::str();
        poVar2 = std::operator<<(poVar2,local_438);
        poVar2 = std::operator<<(poVar2," = in_data[0].te_variable");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,variable_type);
        std::__cxx11::stringstream::str();
        poVar2 = std::operator<<(poVar2,local_458);
        poVar2 = std::operator<<(poVar2," + ");
        poVar2 = std::operator<<(poVar2,(string *)local_288);
        std::operator<<(poVar2,"(");
        std::__cxx11::string::~string(local_458);
        std::__cxx11::string::~string(local_438);
        for (local_45c = 0; local_45c < (uint)variable_type_string.field_2._8_4_;
            local_45c = local_45c + 1) {
          std::ostream::operator<<(&local_198,(uint)current_quad_vertex);
          if (local_45c != variable_type_string.field_2._8_4_ - 1) {
            std::operator<<(&local_198,", ");
          }
          current_quad_vertex._0_4_ = (uint)current_quad_vertex + 1;
        }
        std::operator<<(&local_198,");\n");
        std::__cxx11::stringstream::~stringstream(local_418);
      }
      std::__cxx11::string::~string((string *)local_288);
    }
    poVar2 = std::operator<<(&local_198,"gl_Position = vec4(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(&local_238)[uVar5]);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,quad_vertices[uVar5 - 1]);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,quad_vertices[uVar5]);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,quad_vertices[uVar5 + 1]);
    std::operator<<(poVar2,");\nEmitVertex();\n");
  }
  std::operator<<(&local_198,"EndPrimitive();\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getGeometryShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "layout(triangles)                      in;\n"
					  "layout(triangle_strip, max_vertices=4) out;\n"
					  "\n"

					  /* Add the input block */
					  "in TE_DATA\n"
					  "{\n"
				   << getVariableDeclarations("te", variables) << "} in_data[];\n"
																  "\n"

																  /* Add the output block */
																  "out GS_DATA\n"
																  "{\n"
				   << getVariableDeclarations("gs", variables, "flat") << "};\n"
																		  "\n"

																		  /* Declare main() function */
																		  "void main()\n"
																		  "{\n";

	/* Take input variables, add a predefined value and forward them to output variables */
	const float quad_vertices[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
									1.0f,  -1.0f, 0.0f, 1.0f, 1.0f,  1.0f, 0.0f, 1.0f };
	const unsigned int n_quad_vertices =
		sizeof(quad_vertices) / sizeof(quad_vertices[0]) / 4 /* components per vertex */;
	const size_t n_variables = variables.size();

	for (unsigned int n_quad_vertex = 0; n_quad_vertex < n_quad_vertices; ++n_quad_vertex)
	{
		unsigned int counter			 = 4;
		const float* current_quad_vertex = quad_vertices + n_quad_vertex * 4 /* components per vertex */;

		for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
		{
			unsigned int		  variable_array_size = variables[n_variable].array_size;
			Utils::_variable_type variable_type		  = variables[n_variable].type;
			unsigned int n_variable_type_components   = Utils::getNumberOfComponentsForVariableType(variable_type);
			std::string  variable_type_string		  = Utils::getVariableTypeString(variable_type);

			for (unsigned int index = 0; index < variable_array_size; ++index)
			{
				std::stringstream array_index_sstream;

				if (variable_array_size > 1)
				{
					array_index_sstream << "[" << index << "]";
				}

				result_sstream << "gs_variable" << n_variable << array_index_sstream.str()
							   << " = in_data[0].te_variable" << n_variable << array_index_sstream.str() << " + "
							   << variable_type_string << "(";

				for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
				{
					result_sstream << (counter++);

					if (n_component != (n_variable_type_components - 1))
					{
						result_sstream << ", ";
					}
				} /* for (all components) */

				result_sstream << ");\n";
			} /* for (all array indices) */
		}	 /* for (all variable types) */

		result_sstream << "gl_Position = vec4(" << current_quad_vertex[0] << ", " << current_quad_vertex[1] << ", "
					   << current_quad_vertex[2] << ", " << current_quad_vertex[3] << ");\n"
																					  "EmitVertex();\n";
	} /* for (all emitted quad vertices) */

	result_sstream << "EndPrimitive();\n"
					  "}\n";

	/* All done */
	return result_sstream.str();
}